

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O2

void __thiscall
slang::ast::InstanceCacheKey::InstanceCacheKey
          (InstanceCacheKey *this,InstanceSymbol *symbol,bool *valid)

{
  pointer ppPVar1;
  ParameterSymbol *this_00;
  bool bVar2;
  ConstantValue *this_01;
  Type *this_02;
  pointer ppPVar3;
  InstanceSymbol *symbol_00;
  long lVar4;
  span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL> sVar5;
  span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> sVar6;
  size_t h;
  InstanceCacheKey ifaceKey;
  size_t local_80;
  InstanceCacheKey *local_78;
  IfaceConn local_70;
  InstanceSymbol *local_60;
  InstanceCacheKey local_58;
  
  (this->symbol).ptr = symbol;
  (this->ifaceKeys).
  super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ifaceKeys).
  super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ifaceKeys).
  super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80 = 0;
  local_78 = this;
  local_58.symbol.ptr = (InstanceSymbol *)InstanceSymbol::getDefinition(symbol);
  hash_combine<slang::ast::DefinitionSymbol_const*>(&local_80,(DefinitionSymbol **)&local_58);
  local_60 = symbol;
  sVar5 = InstanceBodySymbol::getParameters(symbol->body);
  for (lVar4 = 0; sVar5._M_extent._M_extent_value._M_extent_value << 3 != lVar4; lVar4 = lVar4 + 8)
  {
    this_00 = (ParameterSymbol *)**(undefined8 **)((long)sVar5._M_ptr + lVar4);
    if ((this_00->super_ValueSymbol).super_Symbol.kind == Parameter) {
      this_01 = ParameterSymbol::getValue(this_00,(SourceRange)ZEXT816(0));
      local_58.symbol.ptr = (InstanceSymbol *)ConstantValue::hash(this_01);
      hash_combine<unsigned_long>(&local_80,(unsigned_long *)&local_58);
    }
    else {
      this_02 = DeclaredType::getType
                          ((DeclaredType *)&(this_00->super_ValueSymbol).declaredType.dimensions);
      local_58.symbol.ptr = (InstanceSymbol *)Type::hash(this_02);
      hash_combine<unsigned_long>(&local_80,(unsigned_long *)&local_58);
    }
  }
  sVar6 = InstanceSymbol::getPortConnections(local_60);
  ppPVar3 = sVar6._M_ptr;
  ppPVar1 = ppPVar3 + sVar6._M_extent._M_extent_value._M_extent_value;
  do {
    if (ppPVar3 == ppPVar1) {
      local_78->savedHash = local_80;
      return;
    }
    if ((*ppPVar3)->port->kind == InterfacePort) {
      local_70 = PortConnection::getIfaceConn(*ppPVar3);
      symbol_00 = (InstanceSymbol *)local_70.first;
      while (symbol_00 != (InstanceSymbol *)0x0) {
        if ((symbol_00->super_InstanceSymbolBase).super_Symbol.kind != InstanceArray) {
          bVar2 = isEligibleForCaching(symbol_00);
          if (!bVar2) {
            *valid = false;
            return;
          }
          InstanceCacheKey(&local_58,symbol_00,valid);
          if (*valid == false) {
            std::
            vector<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
            ::~vector(&local_58.ifaceKeys);
            return;
          }
          std::
          vector<std::pair<slang::ast::InstanceCacheKey,slang::ast::ModportSymbol_const*>,std::allocator<std::pair<slang::ast::InstanceCacheKey,slang::ast::ModportSymbol_const*>>>
          ::emplace_back<slang::ast::InstanceCacheKey,slang::ast::ModportSymbol_const*&>
                    ((vector<std::pair<slang::ast::InstanceCacheKey,slang::ast::ModportSymbol_const*>,std::allocator<std::pair<slang::ast::InstanceCacheKey,slang::ast::ModportSymbol_const*>>>
                      *)&this->ifaceKeys,&local_58,&local_70.second);
          hash_combine<unsigned_long>
                    (&local_80,
                     &(local_78->ifaceKeys).
                      super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].first.savedHash);
          if (local_70.second != (ModportSymbol *)0x0) {
            hash_combine<std::basic_string_view<char,std::char_traits<char>>>
                      (&local_80,&((local_70.second)->super_Symbol).name);
          }
          std::
          vector<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
          ::~vector(&local_58.ifaceKeys);
          break;
        }
        bVar2 = Scope::empty((Scope *)&(symbol_00->super_InstanceSymbolBase).arrayPath);
        if (bVar2) {
          symbol_00 = (InstanceSymbol *)0x0;
        }
        else {
          symbol_00 = *(InstanceSymbol **)&symbol_00->canonicalBody->super_Symbol;
        }
        local_70.first = (Symbol *)symbol_00;
      }
    }
    ppPVar3 = ppPVar3 + 1;
  } while( true );
}

Assistant:

InstanceCacheKey::InstanceCacheKey(const InstanceSymbol& symbol, bool& valid) : symbol(&symbol) {
    size_t h = 0;
    hash_combine(h, &symbol.getDefinition());

    for (auto param : symbol.body.getParameters()) {
        if (param->symbol.kind == SymbolKind::Parameter)
            hash_combine(h, param->symbol.as<ParameterSymbol>().getValue().hash());
        else
            hash_combine(h, param->symbol.as<TypeParameterSymbol>().targetType.getType().hash());
    }

    for (auto conn : symbol.getPortConnections()) {
        if (conn->port.kind == SymbolKind::InterfacePort) {
            auto [iface, modport] = conn->getIfaceConn();
            while (iface && iface->kind == SymbolKind::InstanceArray) {
                auto& arr = iface->as<InstanceArraySymbol>();
                if (arr.empty())
                    iface = nullptr;
                else
                    iface = arr.elements[0];
            }

            if (iface) {
                auto& ifaceInst = iface->as<InstanceSymbol>();
                if (!isEligibleForCaching(ifaceInst)) {
                    valid = false;
                    return;
                }

                InstanceCacheKey ifaceKey(ifaceInst, valid);
                if (!valid)
                    return;

                ifaceKeys.emplace_back(std::move(ifaceKey), modport);
                hash_combine(h, ifaceKeys.back().first.savedHash);

                if (modport)
                    hash_combine(h, modport->name);
            }
        }
    }

    savedHash = h;
}